

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTessellationShaderTessellation.cpp
# Opt level: O0

string * __thiscall
glcts::TessellationShaderTessellationgl_InvocationID_PatchVerticesIn_PrimitiveID::
getTCCode_abi_cxx11_
          (string *__return_storage_ptr__,
          TessellationShaderTessellationgl_InvocationID_PatchVerticesIn_PrimitiveID *this,
          GLuint n_patch_vertices)

{
  ulong uVar1;
  char *pcVar2;
  string *psVar3;
  size_t token_index;
  string local_220 [8];
  string token;
  string local_1f8 [48];
  string local_1c8 [8];
  string n_patch_vertices_string;
  stringstream n_patch_vertices_sstream;
  undefined1 local_198 [380];
  GLuint local_1c;
  TessellationShaderTessellationgl_InvocationID_PatchVerticesIn_PrimitiveID *pTStack_18;
  GLuint n_patch_vertices_local;
  TessellationShaderTessellationgl_InvocationID_PatchVerticesIn_PrimitiveID *this_local;
  string *result;
  
  local_1c = n_patch_vertices;
  pTStack_18 = this;
  this_local = (TessellationShaderTessellationgl_InvocationID_PatchVerticesIn_PrimitiveID *)
               __return_storage_ptr__;
  std::__cxx11::stringstream::stringstream
            ((stringstream *)(n_patch_vertices_string.field_2._M_local_buf + 8));
  std::__cxx11::string::string(local_1c8);
  std::ostream::operator<<(local_198,local_1c);
  std::__cxx11::stringstream::str();
  std::__cxx11::string::operator=(local_1c8,local_1f8);
  std::__cxx11::string::~string(local_1f8);
  pcVar2 = getTCCode::tc_body;
  token.field_2._M_local_buf[0xf] = '\0';
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)__return_storage_ptr__,pcVar2,
             (allocator<char> *)(token.field_2._M_local_buf + 0xe));
  std::allocator<char>::~allocator((allocator<char> *)(token.field_2._M_local_buf + 0xe));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_220,"N_PATCH_VERTICES",(allocator<char> *)((long)&token_index + 7));
  std::allocator<char>::~allocator((allocator<char> *)((long)&token_index + 7));
  while( true ) {
    uVar1 = std::__cxx11::string::find((string *)__return_storage_ptr__,(ulong)local_220);
    if (uVar1 == 0xffffffffffffffff) break;
    pcVar2 = (char *)std::__cxx11::string::length();
    std::__cxx11::string::c_str();
    psVar3 = (string *)std::__cxx11::string::replace((ulong)__return_storage_ptr__,uVar1,pcVar2);
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,psVar3);
    std::__cxx11::string::find((string *)__return_storage_ptr__,(ulong)local_220);
  }
  token.field_2._M_local_buf[0xf] = '\x01';
  std::__cxx11::string::~string(local_220);
  if ((token.field_2._M_local_buf[0xf] & 1U) == 0) {
    std::__cxx11::string::~string((string *)__return_storage_ptr__);
  }
  std::__cxx11::string::~string(local_1c8);
  std::__cxx11::stringstream::~stringstream
            ((stringstream *)(n_patch_vertices_string.field_2._M_local_buf + 8));
  return __return_storage_ptr__;
}

Assistant:

std::string TessellationShaderTessellationgl_InvocationID_PatchVerticesIn_PrimitiveID::getTCCode(
	glw::GLuint n_patch_vertices)
{
	static const char* tc_body =
		"${VERSION}\n"
		"\n"
		"${TESSELLATION_SHADER_REQUIRE}\n"
		"\n"
		"layout(vertices = N_PATCH_VERTICES) out;\n"
		"\n"
		"out TC_OUT\n"
		"{\n"
		"    int tc_invocation_id;\n"
		"    int tc_patch_vertices_in;\n"
		"    int tc_primitive_id;\n"
		"} out_te[];\n"
		"\n"
		"void main()\n"
		"{\n"
		"    gl_out[gl_InvocationID].gl_Position          = gl_in[gl_InvocationID].gl_Position;\n"
		"    out_te[gl_InvocationID].tc_invocation_id     = gl_InvocationID;\n"
		"    out_te[gl_InvocationID].tc_patch_vertices_in = gl_PatchVerticesIn;\n"
		"    out_te[gl_InvocationID].tc_primitive_id      = gl_PrimitiveID;\n"
		"\n"
		"    gl_TessLevelInner[0] = 4.0;\n"
		"    gl_TessLevelInner[1] = 4.0;\n"
		"    gl_TessLevelOuter[0] = 4.0;\n"
		"    gl_TessLevelOuter[1] = 4.0;\n"
		"    gl_TessLevelOuter[2] = 4.0;\n"
		"    gl_TessLevelOuter[3] = 4.0;\n"
		"}\n";

	/* Construct a string out of user-provided integer value */
	std::stringstream n_patch_vertices_sstream;
	std::string		  n_patch_vertices_string;

	n_patch_vertices_sstream << n_patch_vertices;
	n_patch_vertices_string = n_patch_vertices_sstream.str();

	/* Replace N_PATCH_VERTICES with user-provided value */
	std::string		  result	  = tc_body;
	const std::string token		  = "N_PATCH_VERTICES";
	std::size_t		  token_index = std::string::npos;

	while ((token_index = result.find(token)) != std::string::npos)
	{
		result = result.replace(token_index, token.length(), n_patch_vertices_string.c_str());

		token_index = result.find(token);
	}

	return result;
}